

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenThread.cpp
# Opt level: O2

PTR brynet::net::ListenThread::Create(void)

{
  ListenThread *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  PTR PVar3;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>
  local_49;
  ListenThread *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  peVar2 = (element_type *)operator_new(0xa0);
  local_38._M_alloc = &local_49;
  (peVar2->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar2->_vptr_ListenThread = (_func_int **)&PTR___Sp_counted_ptr_inplace_00155140;
  this = (ListenThread *)
         &(peVar2->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
          super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(this,0,0x90);
  ListenThread(this);
  local_38._M_ptr = (pointer)0x0;
  (peVar2->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__ListenThread_00155190;
  local_48 = this;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  std::__weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>::_M_assign
            ((__weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2> *)&peVar2->mIsIPV6,
             this,&_Stack_40);
  _Var1._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_ListenThread = (_func_int **)local_48;
  (in_RDI->super_enable_shared_from_this<brynet::net::ListenThread>)._M_weak_this.
  super___weak_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_48 = (ListenThread *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  PVar3.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar3.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar3.super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ListenThread::PTR ListenThread::Create()
{
    struct make_shared_enabler : public ListenThread {};
    return std::make_shared<make_shared_enabler>();
}